

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

UVector * __thiscall
icu_63::ICUService::getVisibleIDs
          (ICUService *this,UVector *result,UnicodeString *matchID,UErrorCode *status)

{
  UnicodeString *that;
  char cVar1;
  int iVar2;
  Hashtable *this_00;
  undefined4 extraout_var;
  UHashElement *pUVar4;
  UnicodeString *pUVar5;
  int32_t pos;
  Mutex mutex;
  long *plVar3;
  
  UVector::removeAllElements(result);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    mutex.fMutex = (UMutex *)lock;
    umtx_lock_63((UMutex *)lock);
    this_00 = getVisibleIDMap(this,status);
    if (this_00 != (Hashtable *)0x0) {
      iVar2 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,matchID,status);
      plVar3 = (long *)CONCAT44(extraout_var,iVar2);
      pos = -1;
LAB_001a70a3:
      do {
        pUVar5 = (UnicodeString *)&pos;
        pUVar4 = Hashtable::nextElement(this_00,(int32_t *)pUVar5);
        if (pUVar4 == (UHashElement *)0x0) goto LAB_001a7120;
        that = (UnicodeString *)(pUVar4->key).pointer;
        if (plVar3 != (long *)0x0) {
          pUVar5 = that;
          cVar1 = (**(code **)(*plVar3 + 0x40))(plVar3);
          if (cVar1 == '\0') goto LAB_001a70a3;
        }
        pUVar5 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar5);
        if (pUVar5 == (UnicodeString *)0x0) {
LAB_001a7119:
          *status = U_MEMORY_ALLOCATION_ERROR;
          goto LAB_001a7120;
        }
        UnicodeString::UnicodeString(pUVar5,that);
        if ((undefined1  [56])((undefined1  [56])pUVar5->fUnion & (undefined1  [56])0x1) !=
            (undefined1  [56])0x0) {
          (*(pUVar5->super_Replaceable).super_UObject._vptr_UObject[1])(pUVar5);
          goto LAB_001a7119;
        }
        UVector::addElement(result,pUVar5,status);
      } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
      (*(pUVar5->super_Replaceable).super_UObject._vptr_UObject[1])(pUVar5);
LAB_001a7120:
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))(plVar3);
      }
    }
    Mutex::~Mutex(&mutex);
    if (U_ZERO_ERROR < *status) {
      UVector::removeAllElements(result);
    }
  }
  return result;
}

Assistant:

UVector& 
ICUService::getVisibleIDs(UVector& result, const UnicodeString* matchID, UErrorCode& status) const 
{
    result.removeAllElements();

    if (U_FAILURE(status)) {
        return result;
    }

    {
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceKey* fallbackKey = createKey(matchID, status);

            for (int32_t pos = UHASH_FIRST;;) {
                const UHashElement* e = map->nextElement(pos);
                if (e == NULL) {
                    break;
                }

                const UnicodeString* id = (const UnicodeString*)e->key.pointer;
                if (fallbackKey != NULL) {
                    if (!fallbackKey->isFallbackOf(*id)) {
                        continue;
                    }
                }

                UnicodeString* idClone = new UnicodeString(*id);
                if (idClone == NULL || idClone->isBogus()) {
                    delete idClone;
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                result.addElement(idClone, status);
                if (U_FAILURE(status)) {
                    delete idClone;
                    break;
                }
            }
            delete fallbackKey;
        }
    }
    if (U_FAILURE(status)) {
        result.removeAllElements();
    }
    return result;
}